

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

Test * __thiscall
testing::internal::TestFactoryImpl<Computation_Timestep_Test>::CreateTest
          (TestFactoryImpl<Computation_Timestep_Test> *this)

{
  Test *this_00;
  
  this_00 = (Test *)operator_new(0x60);
  Test::Test(this_00);
  this_00[4].gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  this_00[5]._vptr_Test = (_func_int **)0x0;
  this_00[5].gtest_flag_saver_.ptr_ = (GTestFlagSaver *)0x0;
  this_00->_vptr_Test = (_func_int **)&PTR__Test_00145060;
  return this_00;
}

Assistant:

virtual Test* CreateTest() { return new TestClass; }